

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertBinaryEqual
          (UtestShell *this,void *expected,void *actual,size_t length,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  TestResult *pTVar2;
  UtestShell *in_RCX;
  void *in_RDX;
  void *in_RSI;
  long *in_RDI;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_fffffffffffffe58;
  UtestShell *pUVar3;
  SimpleString *in_stack_fffffffffffffe60;
  SimpleString *this_00;
  uchar *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  UtestShell *in_stack_fffffffffffffee8;
  BinaryEqualFailure *in_stack_fffffffffffffef0;
  size_t in_stack_ffffffffffffff00;
  SimpleString *in_stack_ffffffffffffff08;
  SimpleString local_a8;
  undefined1 local_98 [120];
  UtestShell *local_20;
  void *local_18;
  void *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar2 = getTestResult(in_stack_fffffffffffffe58);
  (*pTVar2->_vptr_TestResult[10])();
  pUVar3 = local_20;
  if ((local_20 != (UtestShell *)0x0) && ((local_18 != (void *)0x0 || (local_10 != (void *)0x0)))) {
    if ((local_18 == (void *)0x0) || (this_00 = in_stack_fffffffffffffe60, local_10 == (void *)0x0))
    {
      this_00 = &local_a8;
      SimpleString::SimpleString(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
      BinaryEqualFailure::BinaryEqualFailure
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,(uchar *)in_RDI,
                 in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
      (**(code **)(*in_RDI + 0x138))(in_RDI,local_98,in_stack_00000010);
      BinaryEqualFailure::~BinaryEqualFailure((BinaryEqualFailure *)0x12073e);
      SimpleString::~SimpleString((SimpleString *)0x12074b);
      in_stack_fffffffffffffe58 = pUVar3;
    }
    iVar1 = SimpleString::MemCmp(local_10,local_18,(size_t)local_20);
    if (iVar1 != 0) {
      SimpleString::SimpleString(this_00,(char *)in_stack_fffffffffffffe58);
      BinaryEqualFailure::BinaryEqualFailure
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,(uchar *)in_RDI,
                 in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
      (**(code **)(*in_RDI + 0x138))(in_RDI,&stack0xfffffffffffffee0,in_stack_00000010);
      BinaryEqualFailure::~BinaryEqualFailure((BinaryEqualFailure *)0x120880);
      SimpleString::~SimpleString((SimpleString *)0x12088a);
    }
  }
  return;
}

Assistant:

void UtestShell::assertBinaryEqual(const void *expected, const void *actual, size_t length, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
	if (length == 0) return;
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
    if (SimpleString::MemCmp(expected, actual, length) != 0)
        failWith(BinaryEqualFailure(this, fileName, lineNumber, (const unsigned char *) expected, (const unsigned char *) actual, length, text), testTerminator);
}